

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O1

void cos1D_train<IMLE>(IMLE *imleObj,int nTrain)

{
  double *pdVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  result_type_conflict rVar4;
  double dVar5;
  uniform_01<double,_double> uniform;
  unit_normal_distribution<double> impl;
  Vec z;
  Vec x;
  mt19937 rng;
  new_uniform_01<double> local_a2a;
  unit_normal_distribution<double> local_a29;
  Z local_a28;
  X local_a18;
  IMLE *local_a08;
  double local_a00;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  local_9f8;
  
  local_a08 = imleObj;
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&local_9f8,
         &boost::random::
          mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>
          ::default_seed);
  local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  free((void *)0x0);
  pdVar1 = (double *)malloc(8);
  if (pdVar1 == (double *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = operator_delete;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
  local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar1
  ;
  free((void *)0x0);
  pdVar1 = (double *)malloc(8);
  if (pdVar1 != (double *)0x0) {
    local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
    local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t --- Training, y = cos(x), ",0x1c);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,nTrain);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," training points ---",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    *local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 0.0
    ;
    if (0 < nTrain) {
      do {
        rVar4 = boost::random::detail::new_uniform_01<double>::operator()(&local_a2a,&local_9f8);
        dVar5 = rVar4 * 0.02 +
                *local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        *local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             dVar5;
        local_a00 = cos(dVar5);
        dVar5 = boost::random::detail::unit_normal_distribution<double>::operator()
                          (&local_a29,&local_9f8);
        *local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (dVar5 + 0.0) * 0.1 + local_a00;
        IMLE::update(local_a08,&local_a28,&local_a18);
        *local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double)(~-(ulong)(12.566370614359172 <
                               *local_a28.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data) &
                     (ulong)(*local_a28.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 0.1));
        nTrain = nTrain + -1;
      } while (nTrain != 0);
    }
    free(local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = operator_delete;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void cos1D_train( Learner &imleObj, int nTrain = 2000)
{
    // Noise model
    const Scal NOISE_Z = 0.02;
    const Scal NOISE_X = 0.1;
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    boost::normal_distribution<Scal> normal;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Training
    cout << "\t --- Training, y = cos(x), " << nTrain << " training points ---" << endl;
    z[0] = 0.0;
    for(int k = 0; k < nTrain; k++)
    {
        z[0] += uniform(rng) * NOISE_Z;
        x[0] = cos(z[0]) + NOISE_X * normal(rng);

        imleObj.update(z,x);

        if( z[0] > 4*M_PI )
            z[0] = 0.0;
        else
            z[0] += 0.1;
    }
}